

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O0

void WebPRescalerExportRowShrink_C(WebPRescaler *wrk)

{
  uint8_t *puVar1;
  rescaler_t *prVar2;
  rescaler_t *prVar3;
  int iVar4;
  uint uVar5;
  rescaler_t rVar6;
  long lVar7;
  uint8_t local_48;
  uint8_t local_44;
  int v_1;
  int v;
  uint32_t frac;
  uint32_t yscale;
  rescaler_t *frow;
  int x_out_max;
  rescaler_t *irow;
  uint8_t *dst;
  int x_out;
  WebPRescaler *wrk_local;
  
  puVar1 = wrk->dst;
  prVar2 = wrk->irow;
  iVar4 = wrk->dst_width * wrk->num_channels;
  prVar3 = wrk->frow;
  uVar5 = wrk->fy_scale * -wrk->y_accum;
  if (uVar5 == 0) {
    for (x_out = 0; x_out < iVar4; x_out = x_out + 1) {
      lVar7 = (ulong)prVar2[x_out] * (ulong)wrk->fxy_scale + 0x80000000;
      if ((int)((ulong)lVar7 >> 0x20) < 0x100) {
        local_48 = (uint8_t)((ulong)lVar7 >> 0x20);
      }
      else {
        local_48 = 0xff;
      }
      puVar1[x_out] = local_48;
      prVar2[x_out] = 0;
    }
  }
  else {
    for (x_out = 0; x_out < iVar4; x_out = x_out + 1) {
      rVar6 = (rescaler_t)((ulong)prVar3[x_out] * (ulong)uVar5 >> 0x20);
      lVar7 = (ulong)(prVar2[x_out] - rVar6) * (ulong)wrk->fxy_scale + 0x80000000;
      if ((int)((ulong)lVar7 >> 0x20) < 0x100) {
        local_44 = (uint8_t)((ulong)lVar7 >> 0x20);
      }
      else {
        local_44 = 0xff;
      }
      puVar1[x_out] = local_44;
      prVar2[x_out] = rVar6;
    }
  }
  return;
}

Assistant:

void WebPRescalerExportRowShrink_C(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const uint32_t yscale = wrk->fy_scale * (-wrk->y_accum);
  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0);
  assert(!wrk->y_expand);
  if (yscale) {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const uint32_t frac = (uint32_t)MULT_FIX_FLOOR(frow[x_out], yscale);
      const int v = (int)MULT_FIX(irow[x_out] - frac, wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = frac;   // new fractional start
    }
  } else {
    for (x_out = 0; x_out < x_out_max; ++x_out) {
      const int v = (int)MULT_FIX(irow[x_out], wrk->fxy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
      irow[x_out] = 0;
    }
  }
}